

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_swap.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>_>_>
::_orderRows(Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false>_>_>_>
             *this)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  pointer puVar7;
  uint uVar8;
  
  if (*(int *)&this[1].rowToIndex_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start != 0) {
    uVar8 = 0;
    do {
      uVar6 = (ulong)uVar8;
      puVar7 = this[1].indexToRow_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)this[1].indexToRow_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar7 >> 3) * -0x3333333333333333;
      if (uVar5 < uVar6 || uVar5 - uVar6 == 0) {
LAB_0011b48a:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6
                  );
      }
      puVar7 = puVar7 + uVar6 * 10 + 6;
      puVar4 = *(pointer *)puVar7;
      if (puVar4 != puVar7) {
        puVar2 = (this->rowToIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (this->rowToIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (puVar4 == (pointer)0x0) {
            __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                          "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_vine_options<Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true, false, false>>::Matrix_column_tag, Type = 1]"
                         );
          }
          uVar6 = (ulong)puVar4[4];
          if ((ulong)((long)puVar3 - (long)puVar2 >> 2) <= uVar6) goto LAB_0011b48a;
          puVar4[4] = puVar2[uVar6];
          puVar4 = *(pointer *)puVar4;
        } while (puVar4 != puVar7);
      }
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
      ::
      sort<std::less<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false>>>>>
                ();
      uVar8 = uVar8 + 1;
      uVar1 = *(uint *)&this[1].rowToIndex_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
    } while (uVar8 < uVar1);
    if (uVar1 != 0) {
      puVar7 = (this->indexToRow_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar4 = (this->rowToIndex_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = 0;
      do {
        puVar7[uVar5] = (uint)uVar5;
        puVar4[uVar5] = (uint)uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar5 < *(uint *)&this[1].rowToIndex_.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
    }
  }
  this->rowSwapped_ = false;
  return;
}

Assistant:

inline void Base_swap<Master_matrix, Base_matrix>::_orderRows()
{
  for (unsigned int i = 0; i < _matrix()->get_number_of_columns(); i++) {
    _matrix()->matrix_.at(i).reorder(rowToIndex_, i);
  }
  for (Index i = 0; i < _matrix()->get_number_of_columns(); i++) {
    indexToRow_[i] = i;
    rowToIndex_[i] = i;
  }
  rowSwapped_ = false;
}